

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onRequest(Connection *this,Request *request)

{
  HttpService **this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  uint *puVar4;
  bool bVar5;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  LoopResult LVar6;
  undefined8 *puVar7;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_01;
  HttpHeaders *pHVar8;
  Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *maybe;
  Own<kj::HttpService,_std::nullptr_t> *pOVar9;
  OwnOwn<kj::HttpService,_std::nullptr_t> *pOVar10;
  HttpService *pHVar11;
  RefOrVoid<kj::AsyncInputStream> pAVar12;
  Promise<void> *promise;
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar13;
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar14;
  Promise<void> *pPVar15;
  Own<kj::AsyncInputStream,_std::nullptr_t> *attachments_1;
  Promise<bool> *promise_00;
  long *plVar16;
  undefined8 *puVar17;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method;
  Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
  *this_02;
  Own<kj::HttpService,_std::nullptr_t> *this_03;
  HttpInputStreamImpl *this_04;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_05;
  PromiseAwaiter<void> *__return_storage_ptr__;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  long *plVar18;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___00;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___01;
  Connection *this_06;
  PromiseAwaiter<void> *__return_storage_ptr___02;
  HttpOutputStream *this_07;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *t;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *attachments_00;
  Promise<void> *this_08;
  PromiseAwaiter<bool> *__return_storage_ptr___03;
  Promise<bool> *this_09;
  long in_RDX;
  void *pvVar19;
  undefined4 in_stack_fffffffffffff020;
  undefined4 in_stack_fffffffffffff024;
  int local_f18;
  int local_ed8;
  int local_e78;
  Promise<void> local_b20 [2];
  Promise<bool> local_b10;
  undefined8 local_b08;
  anon_class_24_3_9e98ddcd local_ad8;
  undefined1 local_ac0 [951];
  bool _kj_shouldLog;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined1 local_338 [8];
  OwnOwn<kj::HttpService,_std::nullptr_t> _kj_result;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_2a0 [39];
  long local_28;
  Request *request_local;
  Connection *this_local;
  
  local_28 = in_RDX;
  request_local = request;
  this_local = this;
  puVar7 = (undefined8 *)operator_new(0xc20);
  *puVar7 = onRequest;
  puVar7[1] = onRequest;
  plVar16 = puVar7 + 0x175;
  puVar17 = puVar7 + 0x177;
  method = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar7 + 0x169);
  this_02 = (Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
             *)(puVar7 + 0x16b);
  this_03 = (Own<kj::HttpService,_std::nullptr_t> *)(puVar7 + 0x16d);
  this_04 = (HttpInputStreamImpl *)(puVar7 + 0x16f);
  this_05 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar7 + 0x171);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar7 + 0x47);
  pPVar15 = (Promise<void> *)(puVar7 + 0x178);
  attachments = (Own<kj::HttpService,_std::nullptr_t> *)(puVar7 + 0x179);
  plVar18 = puVar7 + 0x17a;
  pPVar14 = (Promise<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0x17c);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0x7e);
  __return_storage_ptr___01 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 0xb5);
  this_06 = (Connection *)(puVar7 + 0x17d);
  __return_storage_ptr___02 = (PromiseAwaiter<void> *)(puVar7 + 0xec);
  this_07 = (HttpOutputStream *)(puVar7 + 0x17e);
  t = (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)(puVar7 + 0x173)
  ;
  attachments_00 =
       (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
       (puVar7 + 0x17f);
  this_08 = (Promise<void> *)(puVar7 + 0x180);
  __return_storage_ptr___03 = (PromiseAwaiter<bool> *)(puVar7 + 0x123);
  this_09 = (Promise<bool> *)(puVar7 + 0x181);
  this_01 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(puVar7 + 2);
  puVar7[0x182] = request;
  *plVar16 = local_28;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar7 + 0x160),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"onRequest",0x1e2a,0x1b);
  pvVar19 = (void *)puVar7[0x162];
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine
            (this_01,*(SourceLocation *)(puVar7 + 0x160));
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_01);
  bVar5 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar7 + 0xc1d));
  if (!bVar5) {
    *(undefined1 *)((long)puVar7 + 0xc1c) = 0;
    onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),pvVar19);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar7 + 0xc1d));
  pHVar8 = anon_unknown_36::HttpInputStreamImpl::getHeaders
                     ((HttpInputStreamImpl *)(puVar7[0x182] + 0x38));
  *puVar17 = pHVar8;
  OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
            ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)local_2a0,(HttpMethod *)*plVar16);
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
            ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(puVar7[0x182] + 0x148),
             local_2a0);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(local_2a0);
  OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
            ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)method,(HttpMethod *)*plVar16);
  SuspendableRequest::SuspendableRequest
            ((SuspendableRequest *)(puVar7 + 0x15a),(Connection *)puVar7[0x182],method,
             (StringPtr)*(ArrayPtr<const_char> *)(*plVar16 + 8),(HttpHeaders *)*puVar17);
  lVar2 = puVar7[0x182];
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(method);
  Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
  ::operator()(this_02,(SuspendableRequest *)(lVar2 + 0x28));
  if ((*(byte *)(puVar7[0x182] + 0x166) & 1) == 0) {
    maybe = mv<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>>
                      ((Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *)this_02);
    kj::_::readMaybe<kj::HttpService,decltype(nullptr)>((_ *)local_338,maybe);
    pOVar9 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_338);
    if (pOVar9 == (Own<kj::HttpService,_std::nullptr_t> *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                ((Fault *)&stack0xfffffffffffffcc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1e37,FAILED,"kj::mv(maybeService) != nullptr",
                 "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
                 (char (*) [70])
                 "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffcc0);
    }
    pOVar10 = mv<kj::_::OwnOwn<kj::HttpService,decltype(nullptr)>>
                        ((OwnOwn<kj::HttpService,_std::nullptr_t> *)local_338);
    kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::OwnOwn
              ((OwnOwn<kj::HttpService,_std::nullptr_t> *)&_kj_result.value.ptr,pOVar10);
    kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<kj::HttpService,_std::nullptr_t> *)local_338);
    this_00 = &_kj_result.value.ptr;
    pOVar9 = kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::operator*
                       ((OwnOwn<kj::HttpService,_std::nullptr_t> *)this_00);
    Own<kj::HttpService,_std::nullptr_t>::Own(this_03,pOVar9);
    kj::_::OwnOwn<kj::HttpService,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<kj::HttpService,_std::nullptr_t> *)this_00);
    uVar3 = puVar7[0x182];
    OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
              ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_05,(HttpMethod *)*plVar16);
    anon_unknown_36::HttpInputStreamImpl::getEntityBody
              (this_04,(int)uVar3 + 0x38,(OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,
               (uint)this_05,(HttpHeaders *)0x0);
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_05);
    pHVar11 = Own<kj::HttpService,_std::nullptr_t>::operator->(this_03);
    puVar4 = (uint *)*plVar16;
    uVar1 = *puVar4;
    local_538 = *(undefined8 *)(puVar4 + 2);
    uStack_530 = *(undefined8 *)(puVar4 + 4);
    uVar3 = *puVar17;
    pAVar12 = Own<kj::AsyncInputStream,_std::nullptr_t>::operator*
                        ((Own<kj::AsyncInputStream,_std::nullptr_t> *)this_04);
    (**pHVar11->_vptr_HttpService)
              (attachments,pHVar11,(ulong)uVar1,local_538,uStack_530,uVar3,pAVar12,puVar7[0x182]);
    mv<kj::Own<kj::HttpService,decltype(nullptr)>>(this_03);
    Promise<void>::attach<kj::Own<kj::HttpService,decltype(nullptr)>>(pPVar15,attachments);
    promise = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
              await_transform<kj::Promise<void>>(this_01,pPVar15);
    co_await<void>(__return_storage_ptr__,promise);
    bVar5 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar5) {
      *(undefined1 *)((long)puVar7 + 0xc1c) = 1;
      onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),pvVar19);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Promise<void>::~Promise(pPVar15);
    Promise<void>::~Promise((Promise<void> *)attachments);
    pPVar13 = kj::_::readMaybe<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                        ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)
                         (puVar7[0x182] + 0x168));
    *plVar18 = (long)pPVar13;
    if (*plVar18 == 0) {
      local_f18 = 0;
    }
    else {
      lVar2 = puVar7[0x182];
      puVar7[0x17b] = *plVar18;
      pPVar13 = mv<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                          ((Promise<kj::HttpServer::Connection::LoopResult> *)puVar7[0x17b]);
      Promise<kj::HttpServer::Connection::LoopResult>::Promise(pPVar14,pPVar13);
      Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
                ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)(lVar2 + 0x168));
      pPVar13 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>&>
                          (this_01,pPVar14);
      co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___00,pPVar13);
      bVar5 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar5) {
        *(undefined1 *)((long)puVar7 + 0xc1c) = 2;
        onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),pvVar19);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                        (__return_storage_ptr___00);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_01,LVar6);
      kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                (__return_storage_ptr___00);
      Promise<kj::HttpServer::Connection::LoopResult>::~Promise(pPVar14);
      local_f18 = 3;
    }
    if (local_f18 == 0) {
      if ((*(byte *)(puVar7[0x182] + 0x162) & 1) == 0) {
        bVar5 = Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator==
                          ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
                           (puVar7[0x182] + 0x148));
        if (((bVar5 ^ 0xffU) & 1) == 0) {
          bVar5 = anon_unknown_36::HttpOutputStream::isBroken
                            ((HttpOutputStream *)(puVar7[0x182] + 0x128));
          if (bVar5) {
            kj::_::
            CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
            ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                            *)this_01,BREAK_LOOP_CONN_ERR);
            local_ed8 = 3;
          }
          else {
            anon_unknown_36::HttpOutputStream::flush(this_07);
            pPVar15 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                      await_transform<kj::Promise<void>>(this_01,(Promise<void> *)this_07);
            co_await<void>(__return_storage_ptr___02,pPVar15);
            bVar5 = kj::_::PromiseAwaiterBase::await_ready
                              ((PromiseAwaiterBase *)__return_storage_ptr___02);
            if (!bVar5) {
              *(undefined1 *)((long)puVar7 + 0xc1c) = 4;
              onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
                        pvVar19);
              if ((extraout_AL_02 & 1) != 0) {
                return (PromiseBase)(PromiseBase)this;
              }
            }
            kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___02);
            kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___02);
            Promise<void>::~Promise((Promise<void> *)this_07);
            bVar5 = anon_unknown_36::HttpInputStreamImpl::canReuse
                              ((HttpInputStreamImpl *)(puVar7[0x182] + 0x38));
            if (bVar5) {
              if ((*(byte *)(puVar7[0x182] + 0x164) & 1) == 0) {
                kj::_::
                CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                                *)this_01,CONTINUE_LOOP);
                local_ed8 = 3;
              }
              else {
                kj::_::
                CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                                *)this_01,BREAK_LOOP_CONN_ERR);
                local_ed8 = 3;
              }
            }
            else {
              heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
              local_ad8.this = (Connection *)puVar7[0x182];
              local_ad8.body = (Own<kj::AsyncInputStream,_std::nullptr_t> *)this_04;
              local_ad8.dummy = t;
              evalNow<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_1_>
                        ((kj *)local_ac0,&local_ad8);
              SourceLocation::SourceLocation
                        ((SourceLocation *)(puVar7 + 0x163),
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,"onRequest",0x1e8a,0x1a);
              Promise<unsigned_long>::
              catch_<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(kj::Exception&&)_1_>
                        ((Promise<unsigned_long> *)(local_ac0 + 8),(Type *)local_ac0,
                         *(SourceLocation *)(puVar7 + 0x163));
              local_b08 = puVar7[0x182];
              Promise<unsigned_long>::
              then<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(unsigned_long)_1_>
                        ((Promise<unsigned_long> *)attachments_00,(Type *)(local_ac0 + 8));
              Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)(local_ac0 + 8));
              Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_ac0);
              attachments_1 =
                   (Own<kj::AsyncInputStream,_std::nullptr_t> *)
                   mv<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>>
                             (t);
              mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                        ((Own<kj::AsyncInputStream,_std::nullptr_t> *)this_04);
              Promise<bool>::
              attach<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                        (&local_b10,attachments_00,attachments_1);
              Promise<bool>::operator=((Promise<bool> *)attachments_00,&local_b10);
              Promise<bool>::~Promise(&local_b10);
              plVar16 = *(long **)(*(long *)(puVar7[0x182] + 0x18) + 8);
              (**(code **)(*plVar16 + 0x10))
                        (local_b20,plVar16,*(undefined8 *)(*(long *)(puVar7[0x182] + 0x18) + 0x40));
              Promise<void>::
              then<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_2_>
                        (this_08,(Type *)local_b20);
              Promise<void>::~Promise(local_b20);
              mv<kj::Promise<bool>>((Promise<bool> *)this_08);
              SourceLocation::SourceLocation
                        ((SourceLocation *)(puVar7 + 0x166),
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,"onRequest",0x1e9f,0x1d);
              pvVar19 = (void *)puVar7[0x168];
              Promise<bool>::exclusiveJoin
                        (this_09,(Promise<bool> *)attachments_00,*(SourceLocation *)(puVar7 + 0x166)
                        );
              promise_00 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                           await_transform<kj::Promise<bool>>(this_01,this_09);
              co_await<bool>(__return_storage_ptr___03,promise_00);
              bVar5 = kj::_::PromiseAwaiterBase::await_ready
                                ((PromiseAwaiterBase *)__return_storage_ptr___03);
              if (!bVar5) {
                *(undefined1 *)((long)puVar7 + 0xc1c) = 5;
                onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
                          pvVar19);
                if ((extraout_AL_03 & 1) != 0) {
                  return (PromiseBase)(PromiseBase)this;
                }
              }
              bVar5 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr___03);
              kj::_::PromiseAwaiter<bool>::~PromiseAwaiter(__return_storage_ptr___03);
              Promise<bool>::~Promise(this_09);
              *(byte *)((long)puVar7 + 0xc1e) = bVar5;
              if (((*(byte *)((long)puVar7 + 0xc1e) & 1) == 0) ||
                 ((*(byte *)(puVar7[0x182] + 0x164) & 1) != 0)) {
                kj::_::
                CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                                *)this_01,BREAK_LOOP_CONN_ERR);
              }
              else {
                kj::_::
                CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                                *)this_01,CONTINUE_LOOP);
              }
              Promise<bool>::~Promise((Promise<bool> *)this_08);
              Promise<bool>::~Promise((Promise<bool> *)attachments_00);
              Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own(t);
              local_ed8 = 3;
            }
          }
        }
        else {
          sendError(this_06);
          pPVar14 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                    await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                              (this_01,(Promise<kj::HttpServer::Connection::LoopResult> *)this_06);
          co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___01,pPVar14);
          bVar5 = kj::_::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___01);
          if (!bVar5) {
            *(undefined1 *)((long)puVar7 + 0xc1c) = 3;
            onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),pvVar19)
            ;
            if ((extraout_AL_01 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                            (__return_storage_ptr___01);
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_01,LVar6);
          kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                    (__return_storage_ptr___01);
          Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                    ((Promise<kj::HttpServer::Connection::LoopResult> *)this_06);
          local_ed8 = 3;
        }
      }
      else {
        if ((*(byte *)(puVar7[0x182] + 0x163) & 1) == 0) {
          local_ac0[0x3af] = kj::_::Debug::shouldLog(FATAL);
          while ((bool)local_ac0[0x3af] != false) {
            kj::_::Debug::log<char_const(&)[90]>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x1e51,FATAL,
                       "\"Accepted WebSocket object must be destroyed before HttpService \" \"request handler completes.\""
                       ,(char (*) [90])
                        "Accepted WebSocket object must be destroyed before HttpService request handler completes."
                      );
            local_ac0[0x3af] = false;
          }
          abort();
        }
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_01,BREAK_LOOP_CONN_ERR);
        local_ed8 = 3;
      }
    }
    else {
      local_ed8 = local_f18;
    }
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)this_04);
    Own<kj::HttpService,_std::nullptr_t>::~Own(this_03);
    local_e78 = local_ed8;
  }
  else {
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_01,BREAK_LOOP_CONN_ERR);
    local_e78 = 3;
  }
  Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_> *)this_02);
  SuspendableRequest::~SuspendableRequest((SuspendableRequest *)(puVar7 + 0x15a));
  if (local_e78 == 3) {
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_01);
    bVar5 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar7 + 0xc1f));
    if (!bVar5) {
      *puVar7 = 0;
      *(undefined1 *)((long)puVar7 + 0xc1c) = 6;
      onRequest((void *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),pvVar19);
      return (PromiseBase)(PromiseBase)this;
    }
    std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar7 + 0xc1f));
  }
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_01);
  if (puVar7 != (undefined8 *)0x0) {
    operator_delete(puVar7,0xc20);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> onRequest(HttpHeaders::Request& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = request.method;

    SuspendableRequest suspendable(*this, request.method, request.url, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");

    // TODO(perf): If the client disconnects, should we cancel the response? Probably, to
    //   prevent permanent deadlock. It's slightly weird in that arguably the client should
    //   be able to shutdown the upstream but still wait on the downstream, but I believe many
    //   other HTTP servers do similar things.

    auto body = httpInput.getEntityBody(
        HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_await service->request(
        request.method, request.url, headers, *body, *this).attach(kj::mv(service));
    // Response done. Await next request.

    KJ_IF_SOME(p, webSocketError) {
      // sendWebSocketError() was called. Finish sending and close the connection.
      auto promise = kj::mv(p);
      webSocketError = kj::none;
      co_return co_await promise;
    }

    if (upgraded) {
      // We've upgraded to WebSocket, and by now we should have closed the WebSocket.
      if (!webSocketOrConnectClosed) {
        // This is gonna segfault later so abort now instead.
        KJ_LOG(FATAL, "Accepted WebSocket object must be destroyed before HttpService "
                      "request handler completes.");
        abort();
      }

      // Once we start a WebSocket there's no going back to HTTP.
      co_return BREAK_LOOP_CONN_ERR;
    }

    if (currentMethod != kj::none) {
      co_return co_await sendError();
    }

    if (httpOutput.isBroken()) {
      // We started a response but didn't finish it. But HttpService returns success?
      // Perhaps it decided that it doesn't want to finish this response. We'll have to
      // disconnect here. If the response body is not complete (e.g. Content-Length not
      // reached), the client should notice. We don't want to log an error because this
      // condition might be intentional on the service's part.
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();

    if (httpInput.canReuse()) {
      // Things look clean. Go ahead and accept the next request.

      if (closeAfterSend) {
        // We sent Connection: close, so drop the connection now.
        co_return BREAK_LOOP_CONN_ERR;
      } else {
        // Note that we don't have to handle server.draining here because we'll take care
        // of it the next time around the loop.
        co_return CONTINUE_LOOP;
      }
    } else {
      // Apparently, the application did not read the request body. Maybe this is a bug,
      // or maybe not: maybe the client tried to upload too much data and the application
      // legitimately wants to cancel the upload without reading all it it.
      //
      // We have a problem, though: We did send a response, and we didn't send
      // `Connection: close`, so the client may expect that it can send another request.
      // Perhaps the client has even finished sending the previous request's body, in
      // which case the moment it finishes receiving the response, it could be completely
      // within its rights to start a new request. If we close the socket now, we might
      // interrupt that new request.
      //
      // Or maybe we did send `Connection: close`, as indicated by `closeAfterSend` being
      // true. Even in that case, we should still try to read and ignore the request,
      // otherwise when we close the connection the client may get a "connection reset"
      // error before they get a chance to actually read the response body that we sent
      // them.
      //
      // There's no way we can get out of this perfectly cleanly. HTTP just isn't good
      // enough at connection management. The best we can do is give the client some grace
      // period and then abort the connection.

      auto dummy = kj::heap<HttpDiscardingEntityWriter>();
      auto lengthGrace = kj::evalNow([&]() {
        return body->pumpTo(*dummy, server.settings.canceledUploadGraceBytes);
      }).catch_([](kj::Exception&& e) -> uint64_t {
        // Reading from the input failed in some way. This may actually be the whole
        // reason we got here in the first place so don't propagate this error, just
        // give up on discarding the input.
        return 0;  // This zero is ignored but `canReuse()` will return false below.
      }).then([this](uint64_t amount) {
        if (httpInput.canReuse()) {
          // Success, we can continue.
          return true;
        } else {
          // Still more data. Give up.
          return false;
        }
      });
      lengthGrace = lengthGrace.attach(kj::mv(dummy), kj::mv(body));

      auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod)
          .then([]() { return false; });

      auto clean = co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
      if (clean && !closeAfterSend) {
        // We recovered. Continue loop.
        co_return CONTINUE_LOOP;
      } else {
        // Client still not done, or we sent Connection: close and so want to drop the
        // connection anyway. Return broken.
        co_return BREAK_LOOP_CONN_ERR;
      }
    }
  }